

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex.h
# Opt level: O0

int absl::lts_20250127::synchronization_internal::FutexImpl::WaitRelativeTimeout
              (atomic<int> *v,int32_t val,timespec *rel_timeout)

{
  FutexTimespec *pFVar1;
  long lVar2;
  int *piVar3;
  long err;
  FutexTimespec ts;
  timespec *rel_timeout_local;
  int32_t val_local;
  atomic<int> *v_local;
  
  ts.tv_nsec = (long)rel_timeout;
  pFVar1 = ToFutexTimespec(rel_timeout,(FutexTimespec *)&err);
  lVar2 = syscall(0xca,v,0x80,(ulong)(uint)val,pFVar1);
  if (lVar2 == 0) {
    v_local._4_4_ = 0;
  }
  else {
    piVar3 = __errno_location();
    v_local._4_4_ = -*piVar3;
  }
  return v_local._4_4_;
}

Assistant:

static int WaitRelativeTimeout(std::atomic<int32_t>* v, int32_t val,
                                 const struct timespec* rel_timeout) {
    FutexTimespec ts;
    // Atomically check that the futex value is still 0, and if it
    // is, sleep until abs_timeout or until woken by FUTEX_WAKE.
    auto err =
        syscall(SYS_futex, reinterpret_cast<int32_t*>(v), FUTEX_PRIVATE_FLAG,
                val, ToFutexTimespec(rel_timeout, &ts));
    if (err != 0) {
      return -errno;
    }
    return 0;
  }